

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
numeric_specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
::check_sign(numeric_specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>
             *this)

{
  type tVar1;
  
  tVar1 = this->arg_type_;
  if (0xb < tVar1 - named_arg_type) {
    error_handler::on_error((error_handler *)this,"format specifier requires numeric argument");
  }
  if ((tVar1 - named_arg_type < 9) &&
     ((char_type < tVar1 || ((0x214U >> (tVar1 & (custom_type|pointer_type)) & 1) == 0)))) {
    error_handler::on_error((error_handler *)this,"format specifier requires signed argument");
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_sign() {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != int_type &&
        arg_type_ != long_long_type && arg_type_ != internal::char_type) {
      error_handler_.on_error("format specifier requires signed argument");
    }
  }